

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O1

void __thiscall mp::QP2Passes::InitPass1(QP2Passes *this)

{
  QP2PassVisitor::InitPass1(this->visitor_);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->is_term_qp_,
             (long)(int)(this->top_expr_).super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                        super_ExprBase.impl_[1].kind_,false);
  this->n_qp_terms_ = 0;
  return;
}

Assistant:

void QP2Passes::InitPass1() {
  visitor_.InitPass1();
  is_term_qp_.resize(GetTopExpr().num_args());
  n_qp_terms_ = 0;
}